

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

void MatchFinder_Init_2(CMatchFinder *p,int readData)

{
  uint uVar1;
  UInt32 lenLimit;
  uint uVar2;
  uint uVar3;
  UInt32 UVar4;
  uint uVar5;
  uint uVar6;
  
  if ((ulong)p->hashSizeSum != 0) {
    memset(p->hash,0,(ulong)p->hashSizeSum << 2);
  }
  UVar4 = 0;
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  uVar2 = p->cyclicBufferSize;
  p->streamPos = uVar2;
  p->pos = uVar2;
  p->result = 0;
  p->streamEndWasReached = '\0';
  uVar5 = uVar2;
  uVar3 = uVar2;
  if (readData != 0) {
    MatchFinder_ReadBlock(p);
    uVar3 = p->pos;
    uVar2 = p->streamPos;
    uVar5 = p->cyclicBufferSize;
    UVar4 = p->cyclicBufferPos;
  }
  uVar1 = ~uVar3;
  if (uVar5 - UVar4 < ~uVar3) {
    uVar1 = uVar5 - UVar4;
  }
  uVar2 = uVar2 - uVar3;
  uVar6 = uVar2 - p->keepSizeAfter;
  uVar5 = (uint)(uVar2 != 0);
  if (p->keepSizeAfter <= uVar2 && uVar6 != 0) {
    uVar5 = uVar6;
  }
  if (uVar1 <= uVar5) {
    uVar5 = uVar1;
  }
  if (p->matchMaxLen <= uVar2) {
    uVar2 = p->matchMaxLen;
  }
  p->lenLimit = uVar2;
  p->posLimit = uVar5 + uVar3;
  return;
}

Assistant:

void MatchFinder_Init_2(CMatchFinder *p, int readData)
{
  UInt32 i;
  UInt32 *hash = p->hash;
  UInt32 num = p->hashSizeSum;
  for (i = 0; i < num; i++)
    hash[i] = kEmptyHashValue;
  
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->pos = p->streamPos = p->cyclicBufferSize;
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
  
  if (readData)
    MatchFinder_ReadBlock(p);
  
  MatchFinder_SetLimits(p);
}